

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O2

void __thiscall
FOptionMenuNumberField::FOptionMenuNumberField
          (FOptionMenuNumberField *this,char *label,char *menu,float minimum,float maximum,
          float step,char *graycheck)

{
  FOptionMenuFieldBase::FOptionMenuFieldBase(&this->super_FOptionMenuFieldBase,label,menu,graycheck)
  ;
  (this->super_FOptionMenuFieldBase).super_FOptionMenuItem.super_FListMenuItem._vptr_FListMenuItem =
       (_func_int **)&PTR__FOptionMenuItem_006e8630;
  this->mMinimum = minimum;
  this->mMaximum = maximum;
  this->mStep = step;
  if (maximum <= minimum) {
    this->mMinimum = maximum;
    this->mMaximum = minimum;
  }
  if (step <= 0.0) {
    this->mStep = 1.0;
  }
  return;
}

Assistant:

FOptionMenuNumberField ( const char *label, const char* menu, float minimum, float maximum,
		float step, const char* graycheck )
		: FOptionMenuFieldBase ( label, menu, graycheck ),
		mMinimum ( minimum ),
		mMaximum ( maximum ),
		mStep ( step )
	{
		if ( mMaximum <= mMinimum )
			swapvalues( mMinimum, mMaximum );

		if ( mStep <= 0 )
			mStep = 1;
	}